

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::LayerParameter::set_phase(LayerParameter *this,Phase value)

{
  byte *pbVar1;
  
  if (value < 2) {
    pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 6);
    *pbVar1 = *pbVar1 | 2;
    this->phase_ = value;
    return;
  }
  __assert_fail("::caffe::Phase_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                ,0x39ca,"void caffe::LayerParameter::set_phase(::caffe::Phase)");
}

Assistant:

bool Phase_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}